

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_phi(ASMState *as,IRIns *ir)

{
  byte bVar1;
  uint uVar2;
  Reg RVar3;
  long lVar4;
  ASMState *as_00;
  ushort *in_RSI;
  long in_RDI;
  Reg r;
  IRIns *irr;
  IRIns *irl;
  RegSet afree;
  RegSet allow;
  undefined4 in_stack_ffffffffffffffc8;
  TraceError in_stack_ffffffffffffffcc;
  undefined3 in_stack_ffffffffffffffd0;
  RegSet allow_00;
  IRRef in_stack_ffffffffffffffd4;
  
  allow_00 = CONCAT13(1,in_stack_ffffffffffffffd0);
  if ((in_RSI[2] & 0x1f) != 0xe) {
    allow_00 = CONCAT13((in_RSI[2] & 0x1f) == 0xd,in_stack_ffffffffffffffd0);
  }
  uVar2 = 0xffef;
  if ((char)(allow_00 >> 0x18) != '\0') {
    uVar2 = 0xffff0000;
  }
  uVar2 = *(uint *)(in_RDI + 0xa8) & uVar2 & (*(uint *)(in_RDI + 0xb4) ^ 0xffffffff);
  lVar4 = *(long *)(in_RDI + 0x90) + (ulong)*in_RSI * 8;
  as_00 = (ASMState *)(*(long *)(in_RDI + 0x90) + (ulong)in_RSI[1] * 8);
  if ((char)in_RSI[3] != -2) {
    if ((*(char *)(lVar4 + 7) != '\0') || (*(char *)((long)as_00->cost + 7) != '\0')) {
      lj_trace_err((jit_State *)CONCAT44(in_stack_ffffffffffffffd4,allow_00),
                   in_stack_ffffffffffffffcc);
    }
    if ((uVar2 & uVar2 - 1) == 0) {
      if (((*(byte *)(lVar4 + 6) & 0x80) == 0) || ((*(byte *)((long)as_00->cost + 6) & 0x80) == 0))
      {
        lj_trace_err((jit_State *)CONCAT44(in_stack_ffffffffffffffd4,allow_00),
                     in_stack_ffffffffffffffcc);
      }
      ra_spill((ASMState *)CONCAT44(in_stack_ffffffffffffffd4,allow_00),
               (IRIns *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      *(undefined1 *)((long)as_00->cost + 7) = *(undefined1 *)((long)in_RSI + 7);
    }
    else {
      if ((*(byte *)((long)as_00->cost + 6) & 0x80) == 0) {
        RVar3 = ra_scratch((ASMState *)CONCAT44(in_stack_ffffffffffffffd4,allow_00),
                           in_stack_ffffffffffffffcc);
        emit_movrr((ASMState *)CONCAT44(RVar3,allow_00),
                   (IRIns *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0,0x1669b2
                  );
      }
      else {
        RVar3 = ra_allocref(as_00,in_stack_ffffffffffffffd4,allow_00);
      }
      bVar1 = (byte)RVar3;
      *(byte *)(in_RSI + 3) = bVar1;
      *(uint *)(in_RDI + 0xb4) = 1 << (bVar1 & 0x1f) | *(uint *)(in_RDI + 0xb4);
      *(ushort *)(in_RDI + 0x158 + (ulong)RVar3 * 2) = *in_RSI;
      *(byte *)(lVar4 + 4) = *(byte *)(lVar4 + 4) | 0x20;
      if ((*(byte *)(lVar4 + 6) & 0x80) != 0) {
        *(byte *)(lVar4 + 6) = bVar1 | 0x80;
      }
    }
  }
  return;
}

Assistant:

static void asm_phi(ASMState *as, IRIns *ir)
{
  RegSet allow = ((!LJ_SOFTFP && irt_isfp(ir->t)) ? RSET_FPR : RSET_GPR) &
		 ~as->phiset;
  RegSet afree = (as->freeset & allow);
  IRIns *irl = IR(ir->op1);
  IRIns *irr = IR(ir->op2);
  if (ir->r == RID_SINK)  /* Sink PHI. */
    return;
  /* Spill slot shuffling is not implemented yet (but rarely needed). */
  if (ra_hasspill(irl->s) || ra_hasspill(irr->s))
    lj_trace_err(as->J, LJ_TRERR_NYIPHI);
  /* Leave at least one register free for non-PHIs (and PHI cycle breaking). */
  if ((afree & (afree-1))) {  /* Two or more free registers? */
    Reg r;
    if (ra_noreg(irr->r)) {  /* Get a register for the right PHI. */
      r = ra_allocref(as, ir->op2, allow);
    } else {  /* Duplicate right PHI, need a copy (rare). */
      r = ra_scratch(as, allow);
      emit_movrr(as, irr, r, irr->r);
    }
    ir->r = (uint8_t)r;
    rset_set(as->phiset, r);
    as->phireg[r] = (IRRef1)ir->op1;
    irt_setmark(irl->t);  /* Marks left PHIs _with_ register. */
    if (ra_noreg(irl->r))
      ra_sethint(irl->r, r); /* Set register hint for left PHI. */
  } else {  /* Otherwise allocate a spill slot. */
    /* This is overly restrictive, but it triggers only on synthetic code. */
    if (ra_hasreg(irl->r) || ra_hasreg(irr->r))
      lj_trace_err(as->J, LJ_TRERR_NYIPHI);
    ra_spill(as, ir);
    irr->s = ir->s;  /* Set right PHI spill slot. Sync left slot later. */
  }
}